

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

PublicationObject *
anon_unknown.dwarf_7c49a::verifyPublication(HelicsPublication pub,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if ((pub != (HelicsPublication)0x0) && (*pub == -0x684eff5b)) {
      return (PublicationObject *)pub;
    }
  }
  else if (err->error_code == 0) {
    if ((pub != (HelicsPublication)0x0) && (*pub == -0x684eff5b)) {
      return (PublicationObject *)pub;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
  return (PublicationObject *)0x0;
}

Assistant:

helics::PublicationObject* verifyPublication(HelicsPublication pub, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (pub == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidPublicationString);
        return nullptr;
    }
    auto* pubObj = reinterpret_cast<helics::PublicationObject*>(pub);
    if (pubObj->valid != PublicationValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidPublicationString);
        return nullptr;
    }
    return pubObj;
}